

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O2

int __thiscall QtMWidgets::ProgressBarPrivate::init(ProgressBarPrivate *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  int iVar2;
  QPalette *pQVar3;
  QColor *pQVar4;
  QVariantAnimation *pQVar5;
  QSizePolicy sp;
  QVariant local_38;
  
  pQVar3 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(pQVar3,Highlight);
  uVar1 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = uVar1;
  pQVar3 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(pQVar3,Dark);
  uVar1 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->grooveColor = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->grooveColor).ct + 2) = uVar1;
  pQVar3 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(pQVar3,Base);
  uVar1 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->animationColor = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->animationColor).ct + 2) = uVar1;
  sp.field_0 = (anon_union_4_2_313b0b05_for_QSizePolicy_1)(Bits)0x70000;
  if (this->orientation == Vertical) {
    QSizePolicy::transpose(&sp);
  }
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  pQVar5 = (QVariantAnimation *)operator_new(0x10);
  QVariantAnimation::QVariantAnimation(pQVar5,(QObject *)this->q);
  this->animation = pQVar5;
  QVariantAnimation::setDuration((int)pQVar5);
  QAbstractAnimation::setLoopCount((int)this->animation);
  pQVar5 = this->animation;
  QVariant::QVariant(&local_38,0.0);
  QVariantAnimation::setStartValue((QVariant *)pQVar5);
  QVariant::~QVariant(&local_38);
  pQVar5 = this->animation;
  QVariant::QVariant(&local_38,1.0);
  QVariantAnimation::setEndValue((QVariant *)pQVar5);
  QVariant::~QVariant(&local_38);
  iVar2 = QAbstractAnimation::start(this->animation,0);
  return iVar2;
}

Assistant:

void
ProgressBarPrivate::init()
{
	highlightColor = q->palette().color( QPalette::Highlight );
	grooveColor = q->palette().color( QPalette::Dark );
	animationColor = q->palette().color( QPalette::Base );

	QSizePolicy sp( QSizePolicy::Expanding, QSizePolicy::Fixed );
	if( orientation == Qt::Vertical )
		sp.transpose();

	q->setSizePolicy( sp );

	animation = new QVariantAnimation( q );
	animation->setDuration( 500 );
	animation->setLoopCount( -1 );
	animation->setStartValue( 0.0 );
	animation->setEndValue( 1.0 );
	animation->start();
}